

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::
basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>::
short_string_storage::short_string_storage
          (short_string_storage *this,char_type *p,uint8_t length,semantic_tag tag)

{
  string *s;
  byte in_CL;
  byte in_DL;
  void *in_RSI;
  byte *in_RDI;
  assertion_error *this_00;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = *in_RDI & 0xf0 | 7;
  *in_RDI = *in_RDI & 0xf | in_DL << 4;
  in_RDI[1] = in_CL;
  if (0xd < in_DL) {
    s = (string *)__cxa_allocate_exception(0x10);
    this_00 = (assertion_error *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    assertion_error::assertion_error(this_00,s);
    __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  memcpy(in_RDI + 2,in_RSI,(ulong)in_DL);
  in_RDI[(ulong)in_DL + 2] = 0;
  return;
}

Assistant:

short_string_storage(const char_type* p, uint8_t length, semantic_tag tag)
                : storage_kind_(static_cast<uint8_t>(json_storage_kind::short_str)), short_str_length_(length), tag_(tag)
            {
                JSONCONS_ASSERT(length <= max_length);
                std::memcpy(data_,p,length*sizeof(char_type));
                data_[length] = 0;
            }